

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringList.h
# Opt level: O2

void __thiscall llbuild::basic::StringList::StringList(StringList *this,BinaryDecoder *decoder)

{
  uint64_t count;
  char *__dest;
  StringRef contents;
  StringRef local_28;
  
  this->contents = (char *)0x0;
  this->size = 0;
  count = BinaryDecoder::read64(decoder);
  this->size = count;
  local_28.Data = (char *)0x0;
  local_28.Length = 0;
  BinaryDecoder::readBytes(decoder,count,&local_28);
  __dest = (char *)operator_new__(this->size);
  this->contents = __dest;
  memcpy(__dest,local_28.Data,local_28.Length);
  return;
}

Assistant:

StringList(basic::BinaryDecoder& decoder) {
    decoder.read(size);
    StringRef contents;
    decoder.readBytes(size, contents);
    this->contents = new char[size];
    memcpy(this->contents, contents.data(), contents.size());
  }